

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

vm_obj_id_t __thiscall
CVmObjTable::alloc_obj(CVmObjTable *this,int in_root_set,int can_have_refs,int can_have_weak_refs)

{
  vm_obj_id_t id;
  CVmObjPageEntry *entry_00;
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CVmObjTable *in_RDI;
  CVmObjPageEntry *entry;
  vm_obj_id_t ret;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  vm_obj_id_t in_stack_ffffffffffffffd4;
  
  alloc_check_gc((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
  if (in_RDI->first_free_ == 0) {
    alloc_new_page((CVmObjTable *)CONCAT44(in_ESI,in_EDX));
  }
  id = in_RDI->first_free_;
  entry_00 = get_entry(in_RDI,id);
  in_RDI->first_free_ = entry_00->next_obj_;
  if (entry_00->next_obj_ != 0) {
    in_stack_ffffffffffffffd4 = (entry_00->ptr_).prev_free_;
    pCVar1 = get_entry(in_RDI,entry_00->next_obj_);
    (pCVar1->ptr_).prev_free_ = in_stack_ffffffffffffffd4;
  }
  init_entry_for_alloc
            ((CVmObjTable *)CONCAT44(in_ESI,in_EDX),in_ECX,entry_00,(int)((ulong)in_RDI >> 0x20),
             (int)in_RDI,in_stack_ffffffffffffffd4);
  return id;
}

Assistant:

vm_obj_id_t CVmObjTable::alloc_obj(VMG_ int in_root_set,
                                   int can_have_refs, int can_have_weak_refs)
{
    /* count the allocation and maybe perform garbage collection */
    alloc_check_gc(vmg_ TRUE);

    /* if the free list is empty, allocate a new page of object entries */
    if (first_free_ == VM_INVALID_OBJ)
        alloc_new_page();
        
    /* remember the first item in the free list - this is our result */
    vm_obj_id_t ret = first_free_;
    
    /* get the object table entry for the ID */
    CVmObjPageEntry *entry = get_entry(ret);

    /* unlink new entry from the free list */
    first_free_ = entry->next_obj_;
    if (entry->next_obj_ != VM_INVALID_OBJ)
        get_entry(entry->next_obj_)->ptr_.prev_free_ = entry->ptr_.prev_free_;

    /* initialize the entry */
    init_entry_for_alloc(ret, entry, in_root_set,
                         can_have_refs, can_have_weak_refs);

    /* return the free object */
    return ret;
}